

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *o,Literal *literal)

{
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  int32_t iVar4;
  value_type *other;
  int64_t iVar5;
  ostream *poVar6;
  element_type *peVar7;
  char *in_RCX;
  float f;
  double d;
  Iterator IVar8;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar9;
  Name name;
  Literals local_f0;
  uintptr_t local_b8;
  undefined1 local_b0 [8];
  shared_ptr<wasm::GCData> data_1;
  char *local_98;
  undefined1 local_90 [8];
  value_type c;
  Iterator __end6;
  Iterator __begin6;
  Literals *__range6;
  shared_ptr<wasm::GCData> data;
  HeapType heapType;
  Literal *literal_local;
  ostream *o_local;
  
  prepareMinorColor(o);
  bVar1 = Type::isSingle(&literal->type);
  if (!bVar1) {
    __assert_fail("literal.type.isSingle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x221,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  bVar1 = Type::isBasic(&literal->type);
  if (bVar1) {
    BVar2 = Type::getBasic(&literal->type);
    switch(BVar2) {
    case none:
      std::operator<<(o,"?");
      break;
    case unreachable:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x238);
    case i32:
      iVar4 = Literal::geti32(literal);
      std::ostream::operator<<(o,iVar4);
      break;
    case i64:
      iVar5 = Literal::geti64(literal);
      std::ostream::operator<<(o,iVar5);
      break;
    case f32:
      f = Literal::getf32(literal);
      Literal::printFloat(o,f);
      break;
    case f64:
      d = Literal::getf64(literal);
      Literal::printDouble(o,d);
      break;
    case v128:
      std::operator<<(o,"i32x4 ");
      _heapType = Literal::getv128(literal);
      Literal::printVec128(o,(array<unsigned_char,_16UL> *)&heapType);
    }
  }
  else {
    bVar1 = Type::isRef(&literal->type);
    if (!bVar1) {
      __assert_fail("literal.type.isRef()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x23b,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
    }
    data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Type::getHeapType(&literal->type);
    bVar1 = HeapType::isBasic((HeapType *)
                              &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
    if (bVar1) {
      BVar3 = HeapType::getBasic((HeapType *)
                                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
      switch(BVar3) {
      case ext:
        std::operator<<(o,"externref");
        break;
      case func:
      case any:
      case eq:
      case struct_:
      case array:
        handle_unreachable("invalid type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                           ,0x253);
      case i31:
        poVar6 = std::operator<<(o,"i31ref(");
        iVar4 = Literal::geti31(literal,true);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        std::operator<<(poVar6,")");
        break;
      case string:
        Literal::getGCData((Literal *)&stack0xffffffffffffffc0);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc0);
        if (bVar1) {
          std::operator<<(o,"string(\"");
          peVar7 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&stack0xffffffffffffffc0);
          IVar8 = SmallVector<wasm::Literal,_1UL>::begin
                            (&(peVar7->values).super_SmallVector<wasm::Literal,_1UL>);
          __end6.
          super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
          .index = (size_t)IVar8.
                           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                           .parent;
          IVar9 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                   )SmallVector<wasm::Literal,_1UL>::end
                              (&(peVar7->values).super_SmallVector<wasm::Literal,_1UL>);
          while( true ) {
            __end6.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .parent = (SmallVector<wasm::Literal,_1UL> *)IVar9.index;
            c.type.id = (uintptr_t)IVar9.parent;
            bVar1 = SmallVector<wasm::Literal,_1UL>::
                    IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                    ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                  *)&__end6.
                                     super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                     .index,(Iterator *)&c.type);
            if (!bVar1) break;
            other = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                              ((Iterator *)
                               &__end6.
                                super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                .index);
            Literal::Literal((Literal *)local_90,other);
            iVar5 = Literal::getInteger((Literal *)local_90);
            std::operator<<(o,(char)iVar5);
            Literal::~Literal((Literal *)local_90);
            SmallVector<wasm::Literal,_1UL>::
            IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                          *)&__end6.
                             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                             .index);
            IVar9.index = (size_t)__end6.
                                  super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                  .parent;
            IVar9.parent = (SmallVector<wasm::Literal,_1UL> *)c.type.id;
          }
          std::operator<<(o,"\")");
        }
        else {
          std::operator<<(o,"nullstring");
        }
        std::shared_ptr<wasm::GCData>::~shared_ptr
                  ((shared_ptr<wasm::GCData> *)&stack0xffffffffffffffc0);
        break;
      case stringview_wtf8:
      case stringview_wtf16:
      case stringview_iter:
        handle_unreachable("TODO: string literals",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                           ,0x265);
      case none:
        std::operator<<(o,"nullref");
        break;
      case noext:
        std::operator<<(o,"nullexternref");
        break;
      case nofunc:
        std::operator<<(o,"nullfuncref");
      }
    }
    else {
      bVar1 = HeapType::isSignature
                        ((HeapType *)
                         &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
        poVar6 = std::operator<<(o,"funcref(");
        join_0x00000010_0x00000000_ = (string_view)Literal::getFunc(literal);
        name.super_IString.str._M_str = in_RCX;
        name.super_IString.str._M_len = (size_t)local_98;
        poVar6 = operator<<((wasm *)poVar6,
                            (ostream *)
                            data_1.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,name);
        std::operator<<(poVar6,")");
      }
      else {
        bVar1 = Literal::isData(literal);
        if (!bVar1) {
          __assert_fail("literal.isData()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                        ,0x26a,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
        }
        Literal::getGCData((Literal *)local_b0);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b0);
        if (!bVar1) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                        ,0x26c,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
        }
        poVar6 = std::operator<<(o,"[ref ");
        peVar7 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b0);
        local_b8 = (peVar7->type).id;
        poVar6 = operator<<(poVar6,(HeapType)local_b8);
        poVar6 = std::operator<<(poVar6,' ');
        peVar7 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b0);
        Literals::Literals(&local_f0,&peVar7->values);
        poVar6 = operator<<(poVar6,&local_f0);
        std::operator<<(poVar6,']');
        Literals::~Literals(&local_f0);
        std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)local_b0);
      }
    }
  }
  restoreNormalColor(o);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Literal literal) {
  prepareMinorColor(o);
  assert(literal.type.isSingle());
  if (literal.type.isBasic()) {
    switch (literal.type.getBasic()) {
      case Type::none:
        o << "?";
        break;
      case Type::i32:
        o << literal.geti32();
        break;
      case Type::i64:
        o << literal.geti64();
        break;
      case Type::f32:
        literal.printFloat(o, literal.getf32());
        break;
      case Type::f64:
        literal.printDouble(o, literal.getf64());
        break;
      case Type::v128:
        o << "i32x4 ";
        literal.printVec128(o, literal.getv128());
        break;
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    assert(literal.type.isRef());
    auto heapType = literal.type.getHeapType();
    if (heapType.isBasic()) {
      switch (heapType.getBasic()) {
        case HeapType::i31:
          o << "i31ref(" << literal.geti31() << ")";
          break;
        case HeapType::none:
          o << "nullref";
          break;
        case HeapType::noext:
          o << "nullexternref";
          break;
        case HeapType::nofunc:
          o << "nullfuncref";
          break;
        case HeapType::ext:
          o << "externref";
          break;
        case HeapType::any:
        case HeapType::eq:
        case HeapType::func:
        case HeapType::struct_:
        case HeapType::array:
          WASM_UNREACHABLE("invalid type");
        case HeapType::string: {
          auto data = literal.getGCData();
          if (!data) {
            o << "nullstring";
          } else {
            o << "string(\"";
            for (auto c : data->values) {
              // TODO: more than ascii
              o << char(c.getInteger());
            }
            o << "\")";
          }
          break;
        }
        case HeapType::stringview_wtf8:
        case HeapType::stringview_wtf16:
        case HeapType::stringview_iter:
          WASM_UNREACHABLE("TODO: string literals");
      }
    } else if (heapType.isSignature()) {
      o << "funcref(" << literal.getFunc() << ")";
    } else {
      assert(literal.isData());
      auto data = literal.getGCData();
      assert(data);
      o << "[ref " << data->type << ' ' << data->values << ']';
    }
  }
  restoreNormalColor(o);
  return o;
}